

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::updateSource(DefaultUnfoundedCheck *this,AtomData *atom,BodyPtr *n)

{
  NodeId NVar1;
  reference pBVar2;
  long in_RDX;
  AtomData *in_RSI;
  long in_RDI;
  
  NVar1 = AtomData::watch(in_RSI);
  if (NVar1 != 0x1fffffff) {
    NVar1 = AtomData::watch(in_RSI);
    pBVar2 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
             ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                           *)(in_RDI + 0x38),NVar1);
    *(uint *)pBVar2 = *(uint *)pBVar2 & 0x80000000 | (*(uint *)pBVar2 & 0x7fffffff) - 1 & 0x7fffffff
    ;
  }
  AtomData::setSource(in_RSI,*(NodeId *)(in_RDX + 8));
  pBVar2 = bk_lib::
           pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
           ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                         *)(in_RDI + 0x38),*(size_type *)(in_RDX + 8));
  *(uint *)pBVar2 = *(uint *)pBVar2 & 0x80000000 | (*(uint *)pBVar2 & 0x7fffffff) + 1 & 0x7fffffff;
  return;
}

Assistant:

void DefaultUnfoundedCheck::updateSource(AtomData& atom, const BodyPtr& n) {
	if (atom.watch() != AtomData::nill_source) {
		--bodies_[atom.watch()].watches;
	}
	atom.setSource(n.id);
	++bodies_[n.id].watches;
}